

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attr.c
# Opt level: O0

int get_attr(attr_list list,int index,atom_t *name,attr_value_type *val_type,attr_value *value)

{
  int iVar1;
  atom_t *in_RCX;
  undefined4 *in_RDX;
  int in_ESI;
  short *in_RDI;
  attr_value_type *in_R8;
  int count;
  int i;
  int in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffe8;
  int local_4;
  
  if (*in_RDI == 0) {
    if (in_ESI < (int)(uint)*(byte *)(*(long *)(in_RDI + 8) + 1)) {
      *in_RDX = *(undefined4 *)(*(long *)(in_RDI + 8) + 4 + (long)in_ESI * 8);
      *in_RCX = 1;
      *(long *)in_R8 = (long)*(int *)(*(long *)(in_RDI + 8) + 8 + (long)in_ESI * 8);
      local_4 = 1;
    }
    else {
      iVar1 = in_ESI - (uint)*(byte *)(*(long *)(in_RDI + 8) + 1);
      if (iVar1 < (int)(uint)*(byte *)(*(long *)(in_RDI + 8) + 2)) {
        *in_RDX = *(undefined4 *)(*(long *)(in_RDI + 4) + (long)iVar1 * 0x18);
        *in_RCX = *(atom_t *)(*(long *)(in_RDI + 4) + (long)iVar1 * 0x18 + 4);
        *(long *)in_R8 = *(long *)(*(long *)(in_RDI + 4) + (long)iVar1 * 0x18 + 8);
        local_4 = 1;
      }
      else {
        local_4 = 0;
      }
    }
  }
  else {
    for (iVar1 = 0; iVar1 < *(int *)(in_RDI + 4); iVar1 = iVar1 + 1) {
      in_stack_ffffffffffffffc8 = attr_count((attr_list)CONCAT44(iVar1,in_stack_ffffffffffffffc8));
      if (in_ESI < in_stack_ffffffffffffffc8) {
        iVar1 = get_attr((attr_list)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
                         (int)((ulong)in_RDX >> 0x20),in_RCX,in_R8,
                         (attr_value *)CONCAT44(iVar1,in_stack_ffffffffffffffc8));
        return iVar1;
      }
      in_ESI = in_ESI - in_stack_ffffffffffffffc8;
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int
get_attr(attr_list list,int index, atom_t *name,
	  attr_value_type *val_type, attr_value *value)
{
    if (!list->list_of_lists) {
	if (index < list->l.list.iattrs->int_attr_count) {
	    *name = list->l.list.iattrs->iattr[index].attr_id;
	    *val_type = Attr_Int4;
	    *value = (attr_value) (long) list->l.list.iattrs->iattr[index].value;
	    return 1;
	}
	index -= list->l.list.iattrs->int_attr_count;
	if (index < list->l.list.iattrs->other_attr_count) {
	    *name = list->l.list.attributes[index].attr_id;
	    *val_type = list->l.list.attributes[index].val_type;
	    *value = (int64_t)list->l.list.attributes[index].value.u.l;
	    return 1;
	}
	return 0;
    } else {
        int i;
        for (i=0; i<list->l.lists.sublist_count; i++) {
            int count = attr_count(list->l.lists.lists[i]);
            if (index < count) {
                return get_attr(list->l.lists.lists[i], index, name, 
				val_type, value);
            } else {
                index -= count;
            }
        }
        return 0;
    }   
}